

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::PointerBuilder::initStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementCount elementCount,
          StructSize elementSize)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  BuilderArena *this_00;
  ulong uVar1;
  word *pwVar2;
  ulong uVar3;
  uint amount;
  AllocateResult AVar4;
  anon_class_1_0_00000001 local_57;
  anon_class_1_0_00000001 local_56;
  anon_class_1_0_00000001 local_55;
  StructSize local_54;
  CapTableBuilder *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  ref = this->pointer;
  segment = this->segment;
  AVar4.words = (word *)ref;
  AVar4.segment = segment;
  local_50 = this->capTable;
  if (0x1fffffff < elementCount) {
    ::anon_func::anon_class_1_0_00000001::operator()(&local_56);
  }
  local_40 = (ulong)((uint)elementSize & 0xffff);
  local_48 = (ulong)(((uint)elementSize & 0xffff) + ((uint)elementSize >> 0x10));
  uVar3 = elementCount * local_48;
  local_54 = elementSize;
  local_38 = (ulong)elementCount;
  if (0x1ffffffe < uVar3) {
    WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()(&local_57);
  }
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,local_50,ref);
  }
  pwVar2 = segment->pos;
  uVar1 = uVar3 + 1 & 0xffffffff;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar2)) >> 3 < (long)uVar1) ||
     (segment->pos = pwVar2 + uVar1, pwVar2 == (word *)0x0)) {
    amount = (int)uVar3 + 2;
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    if (0x1fffffff < amount) {
      WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_55);
    }
    AVar4 = BuilderArena::allocate(this_00,amount);
    (ref->offsetAndKind).value =
         (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar4.segment)->super_SegmentReader).id.value;
    *(undefined4 *)&(AVar4.words)->content = 1;
    pwVar2 = AVar4.words + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pwVar2 - (long)ref) >> 1) & 0xfffffffc) - 3;
  }
  *(int *)((long)&(AVar4.words)->content + 4) = (int)uVar3 * 8 + 7;
  *(ListElementCount *)&pwVar2->content = (ListElementCount)local_38 * 4;
  *(StructDataWordCount *)((long)&pwVar2->content + 4) = local_54.data;
  *(StructPointerCount *)((long)&pwVar2->content + 6) = elementSize.pointers;
  __return_storage_ptr__->segment = AVar4.segment;
  __return_storage_ptr__->capTable = local_50;
  __return_storage_ptr__->ptr = (byte *)(pwVar2 + 1);
  __return_storage_ptr__->elementCount = (ListElementCount)local_38;
  __return_storage_ptr__->step = (int)local_48 << 6;
  __return_storage_ptr__->structDataSize = (int)local_40 << 6;
  __return_storage_ptr__->structPointerCount = elementSize.pointers;
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::initStructList(ElementCount elementCount, StructSize elementSize) {
  return WireHelpers::initStructListPointer(pointer, segment, capTable, elementCount, elementSize);
}